

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O1

void av1_build_nmv_component_cost_table
               (int *mvcost,nmv_component *mvcomp,MvSubpelPrecision precision)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  aom_cdf_prob (*cdf) [3];
  aom_cdf_prob (*cdf_00) [5];
  int *piVar21;
  bool bVar22;
  int hp_cost [2];
  int class0_hp_cost [2];
  int sign_cost [2];
  int class0_cost [2];
  int cost_swap [10];
  int fp_cost [4];
  int class_cost [11];
  int class0_fp_cost [2] [4];
  int bits_cost [10] [2];
  int local_148 [5];
  int local_134;
  int local_120 [14];
  int local_e8 [5];
  int aiStack_d4 [9];
  int local_b0;
  int local_a8 [30];
  
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_e8[0] = 0;
  local_e8[1] = 0;
  local_e8[2] = 0;
  local_e8[3] = 0;
  lVar18 = 0;
  local_148[2] = 0;
  local_148[3] = 0;
  local_148[0] = 0;
  local_148[1] = 0;
  av1_cost_tokens_from_cdf(local_148 + 4,mvcomp->sign_cdf,(int *)0x0);
  av1_cost_tokens_from_cdf(local_e8 + 4,mvcomp->classes_cdf,(int *)0x0);
  av1_cost_tokens_from_cdf(local_120,mvcomp->class0_cdf,(int *)0x0);
  cdf = mvcomp->bits_cdf;
  do {
    av1_cost_tokens_from_cdf((int *)((long)local_a8 + lVar18 + 0x20),*cdf,(int *)0x0);
    cdf = cdf + 1;
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x50);
  if (-1 < precision) {
    cdf_00 = mvcomp->class0_fp_cdf;
    lVar18 = 0;
    do {
      av1_cost_tokens_from_cdf((int *)((long)local_a8 + lVar18),*cdf_00,(int *)0x0);
      lVar18 = lVar18 + 0x10;
      cdf_00 = cdf_00 + 1;
    } while (lVar18 == 0x10);
    av1_cost_tokens_from_cdf(local_e8,mvcomp->fp_cdf,(int *)0x0);
  }
  if ('\0' < precision) {
    av1_cost_tokens_from_cdf(local_148 + 2,mvcomp->class0_hp_cdf,(int *)0x0);
    av1_cost_tokens_from_cdf(local_148,mvcomp->hp_cdf,(int *)0x0);
  }
  local_120[6] = 0;
  local_120[7] = 0;
  local_120[8] = 0;
  local_120[9] = 0;
  local_120[2] = 0;
  local_120[3] = 0;
  local_120[4] = 0;
  local_120[5] = 0;
  local_120[10] = 0;
  local_120[0xb] = 0;
  uVar4 = 1;
  do {
    iVar11 = local_a8[uVar4 * 2 + 7];
    local_120[uVar4 + 2] = iVar11;
    if (1 < uVar4) {
      local_120[uVar4 + 2] = iVar11 - local_e8[uVar4 + 3];
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 10);
  lVar18 = 0;
  do {
    *(ulong *)(mvcost + lVar18 * 2 + 1) =
         CONCAT44(local_e8[lVar18] + local_148[4] + SUB84(local_148._0_8_,4),
                  local_e8[lVar18] + local_148[4] + (int)local_148._0_8_);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 4);
  iVar11 = local_134 - local_148[4];
  *mvcost = 0;
  piVar15 = mvcost + 1;
  lVar9 = 1;
  lVar18 = 0;
  do {
    iVar12 = 0;
    if (lVar18 != 0) {
      iVar12 = local_e8[lVar18 + 4];
    }
    iVar19 = local_a8[lVar18 * 2 + 8];
    lVar6 = 0;
    iVar13 = 0;
    do {
      iVar3 = 8 << ((byte)lVar6 & 0x1f);
      if (iVar13 < iVar3) {
        iVar2 = local_120[lVar6 + 2];
        lVar14 = (long)iVar13;
        lVar1 = (ulong)(uint)(8 << ((byte)lVar18 & 0x1f)) + lVar14;
        lVar10 = -(lVar1 << 0x20);
        lVar20 = 0;
        do {
          lVar10 = lVar10 + -0x100000000;
          iVar7 = piVar15[lVar14 + lVar20] + iVar12 + iVar2;
          piVar15[lVar1 + lVar20] = iVar7;
          *(int *)((long)mvcost + (lVar10 >> 0x1e)) = iVar7 + iVar11;
          lVar20 = lVar20 + 1;
        } while (iVar3 - lVar14 != lVar20);
        iVar13 = iVar13 + (int)lVar20;
      }
      local_120[lVar6 + 2] = local_120[lVar6 + 2] + iVar19;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar9);
    lVar18 = lVar18 + 1;
    lVar9 = lVar9 + 1;
  } while (lVar18 != 10);
  lVar18 = 0;
  iVar12 = 0;
  do {
    uVar8 = 8 << ((byte)lVar18 & 0x1f);
    if (iVar12 < (int)uVar8) {
      iVar19 = local_120[lVar18 + 2];
      lVar6 = (long)iVar12;
      piVar5 = mvcost + lVar6 + 0x2001;
      lVar9 = 0;
      do {
        iVar13 = piVar5[-0x2000] + local_b0 + iVar19;
        *piVar5 = iVar13;
        mvcost[(lVar9 + -0x2001) - lVar6] = iVar13 + iVar11;
        lVar9 = lVar9 + -1;
        piVar5 = piVar5 + 1;
      } while (lVar6 - (ulong)uVar8 != lVar9);
      iVar12 = iVar12 - (int)lVar9;
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 10);
  if (iVar12 < 0x1fff) {
    lVar18 = (long)iVar12;
    piVar5 = mvcost + (-0x2001 - lVar18);
    do {
      iVar12 = mvcost[lVar18 + 1] + (local_a8[0x1b] - aiStack_d4[8]) + local_b0;
      mvcost[lVar18 + 0x2001] = iVar12;
      lVar18 = lVar18 + 1;
      *piVar5 = iVar12 + iVar11;
      piVar5 = piVar5 + -1;
    } while (lVar18 != 0x1fff);
  }
  piVar5 = mvcost + -1;
  lVar18 = 0;
  do {
    iVar11 = local_120[lVar18];
    lVar9 = 0;
    piVar16 = piVar15;
    piVar17 = piVar5;
    do {
      iVar12 = local_a8[lVar18 * 4 + lVar9];
      lVar6 = 0;
      piVar21 = piVar17;
      do {
        iVar19 = local_148[lVar6 + 2] + iVar12 + local_e8[4] + iVar11;
        piVar16[lVar6] = local_148[4] + iVar19;
        *piVar21 = iVar19 + local_134;
        lVar6 = lVar6 + 1;
        piVar21 = piVar21 + -1;
      } while (lVar6 == 1);
      lVar9 = lVar9 + 1;
      piVar17 = piVar17 + -2;
      piVar16 = piVar16 + 2;
    } while (lVar9 != 4);
    piVar5 = piVar5 + -8;
    piVar15 = piVar15 + 8;
    bVar22 = lVar18 == 0;
    lVar18 = lVar18 + 1;
  } while (bVar22);
  return;
}

Assistant:

void av1_build_nmv_component_cost_table(int *mvcost,
                                        const nmv_component *const mvcomp,
                                        MvSubpelPrecision precision) {
  int i, j, v, o, mantissa;
  int sign_cost[2], class_cost[MV_CLASSES], class0_cost[CLASS0_SIZE];
  int bits_cost[MV_OFFSET_BITS][2];
  int class0_fp_cost[CLASS0_SIZE][MV_FP_SIZE] = { 0 },
      fp_cost[MV_FP_SIZE] = { 0 };
  int class0_hp_cost[2] = { 0 }, hp_cost[2] = { 0 };

  av1_cost_tokens_from_cdf(sign_cost, mvcomp->sign_cdf, NULL);
  av1_cost_tokens_from_cdf(class_cost, mvcomp->classes_cdf, NULL);
  av1_cost_tokens_from_cdf(class0_cost, mvcomp->class0_cdf, NULL);
  for (i = 0; i < MV_OFFSET_BITS; ++i) {
    av1_cost_tokens_from_cdf(bits_cost[i], mvcomp->bits_cdf[i], NULL);
  }

  if (precision > MV_SUBPEL_NONE) {
    for (i = 0; i < CLASS0_SIZE; ++i)
      av1_cost_tokens_from_cdf(class0_fp_cost[i], mvcomp->class0_fp_cdf[i],
                               NULL);
    av1_cost_tokens_from_cdf(fp_cost, mvcomp->fp_cdf, NULL);
  }

  if (precision > MV_SUBPEL_LOW_PRECISION) {
    av1_cost_tokens_from_cdf(class0_hp_cost, mvcomp->class0_hp_cdf, NULL);
    av1_cost_tokens_from_cdf(hp_cost, mvcomp->hp_cdf, NULL);
  }

  // Instead of accumulating the cost of each vector component's bits
  //   individually, compute the costs based on smaller vectors. Costs for
  //   [2^exp, 2 * 2^exp - 1] are calculated based on [0, 2^exp - 1]
  //   respectively. Offsets are maintained to swap both 1) class costs when
  //   treated as a complete vector component with the highest set bit when
  //   treated as a mantissa (significand) and 2) leading zeros to account for
  //   the current exponent.

  // Cost offsets
  int cost_swap[MV_OFFSET_BITS] = { 0 };
  // Delta to convert positive vector to negative vector costs
  int negate_sign = sign_cost[1] - sign_cost[0];

  // Initialize with offsets to swap the class costs with the costs of the
  //   highest set bit.
  for (i = 1; i < MV_OFFSET_BITS; ++i) {
    cost_swap[i] = bits_cost[i - 1][1];
    if (i > CLASS0_BITS) cost_swap[i] -= class_cost[i - CLASS0_BITS];
  }

  // Seed the fractional costs onto the output (overwritten latter).
  for (o = 0; o < MV_FP_SIZE; ++o) {
    int hp;
    for (hp = 0; hp < 2; ++hp) {
      v = 2 * o + hp + 1;
      mvcost[v] = fp_cost[o] + hp_cost[hp] + sign_cost[0];
    }
  }

  mvcost[0] = 0;
  // Fill the costs for each exponent's vectors, using the costs set in the
  //   previous exponents.
  for (i = 0; i < MV_OFFSET_BITS; ++i) {
    const int exponent = (2 * MV_FP_SIZE) << i;

    int class = 0;
    if (i >= CLASS0_BITS) {
      class = class_cost[i - CLASS0_BITS + 1];
    }

    // Iterate through mantissas, keeping track of the location
    //   of the highest set bit for the mantissa.
    // To be clear: in the outer loop, the position of the highest set bit
    //   (exponent) is tracked and, in this loop, the highest set bit of the
    //   mantissa is tracked.
    mantissa = 0;
    for (j = 0; j <= i; ++j) {
      for (; mantissa < (2 * MV_FP_SIZE) << j; ++mantissa) {
        int cost = mvcost[mantissa + 1] + class + cost_swap[j];
        v = exponent + mantissa + 1;
        mvcost[v] = cost;
        mvcost[-v] = cost + negate_sign;
      }
      cost_swap[j] += bits_cost[i][0];
    }
  }

  // Special case to avoid buffer overrun
  {
    int exponent = (2 * MV_FP_SIZE) << MV_OFFSET_BITS;
    int class = class_cost[MV_CLASSES - 1];
    mantissa = 0;
    for (j = 0; j < MV_OFFSET_BITS; ++j) {
      for (; mantissa < (2 * MV_FP_SIZE) << j; ++mantissa) {
        int cost = mvcost[mantissa + 1] + class + cost_swap[j];
        v = exponent + mantissa + 1;
        mvcost[v] = cost;
        mvcost[-v] = cost + negate_sign;
      }
    }
    // At this point: mantissa = exponent >> 1

    // Manually calculate the final cost offset
    int cost_swap_hi =
        bits_cost[MV_OFFSET_BITS - 1][1] - class_cost[MV_CLASSES - 2];
    for (; mantissa < exponent - 1; ++mantissa) {
      int cost = mvcost[mantissa + 1] + class + cost_swap_hi;
      v = exponent + mantissa + 1;
      mvcost[v] = cost;
      mvcost[-v] = cost + negate_sign;
    }
  }

  // Fill costs for class0 vectors, overwriting previous placeholder values
  //   used for calculating the costs of the larger vectors.
  for (i = 0; i < CLASS0_SIZE; ++i) {
    const int top = i * 2 * MV_FP_SIZE;
    for (o = 0; o < MV_FP_SIZE; ++o) {
      int hp;
      int cost = class0_fp_cost[i][o] + class_cost[0] + class0_cost[i];
      for (hp = 0; hp < 2; ++hp) {
        v = top + 2 * o + hp + 1;
        mvcost[v] = cost + class0_hp_cost[hp] + sign_cost[0];
        mvcost[-v] = cost + class0_hp_cost[hp] + sign_cost[1];
      }
    }
  }
}